

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void msd_A_lsd_adaptive6(uchar **strings,size_t N)

{
  size_t N_local;
  uchar **strings_local;
  
  msd_A_lsd_adaptive<6u>(strings,N);
  return;
}

Assistant:

void msd_A_lsd_adaptive6(unsigned char** strings, size_t N)
{ msd_A_lsd_adaptive<6>(strings, N); }